

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O2

void ggml_set_f32_1d(ggml_tensor *tensor,int i,float value)

{
  ggml_type gVar1;
  void *pvVar2;
  char cVar3;
  ggml_bf16_t gVar4;
  undefined1 auVar5 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar6 [64];
  int64_t id [4];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  
  auVar6._4_60_ = in_register_00001204;
  auVar6._0_4_ = value;
  cVar3 = ggml_is_contiguous();
  if (cVar3 == '\0') {
    local_38 = 0;
    uStack_30 = 0;
    uStack_28 = 0;
    uStack_20 = 0;
    ggml_unravel_index(tensor,(long)i,&local_38,&uStack_30,&uStack_28,&uStack_20);
    ggml_set_f32_nd(tensor,(int)local_38,(int)uStack_30,(int)uStack_28,(int)uStack_20,value);
  }
  else {
    gVar1 = tensor->type;
    switch(gVar1) {
    case GGML_TYPE_I8:
      *(char *)((long)tensor->data + (long)i) = (char)(int)value;
      break;
    case GGML_TYPE_I16:
      *(short *)((long)tensor->data + (long)i * 2) = (short)(int)value;
      break;
    case GGML_TYPE_I32:
      *(int *)((long)tensor->data + (long)i * 4) = (int)value;
      break;
    case GGML_TYPE_I64:
    case GGML_TYPE_F64:
    case GGML_TYPE_IQ1_M:
switchD_0010d4c6_caseD_1b:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
                 ,0x459,"fatal error");
    case GGML_TYPE_BF16:
      pvVar2 = tensor->data;
      gVar4 = ggml_compute_fp32_to_bf16(value);
      *(uint16_t *)((long)pvVar2 + (long)i * 2) = gVar4.bits;
      break;
    default:
      if (gVar1 == GGML_TYPE_F32) {
        *(float *)((long)tensor->data + (long)i * 4) = value;
      }
      else {
        if (gVar1 != GGML_TYPE_F16) goto switchD_0010d4c6_caseD_1b;
        auVar5 = vcvtps2ph_f16c(auVar6._0_16_,0);
        vpextrw_avx(auVar5,0);
      }
    }
  }
  return;
}

Assistant:

void ggml_set_f32_1d(const struct ggml_tensor * tensor, int i, float value) {
    if (!ggml_is_contiguous(tensor)) {
        int64_t id[4] = { 0, 0, 0, 0 };
        ggml_unravel_index(tensor, i, &id[0], &id[1], &id[2], &id[3]);
        ggml_set_f32_nd(tensor, id[0], id[1], id[2], id[3], value);
        return;
    }
    switch (tensor->type) {
        case GGML_TYPE_I8:
            {
                ((int8_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_I16:
            {
                ((int16_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_I32:
            {
                ((int32_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_F16:
            {
                ((ggml_fp16_t *)(tensor->data))[i] = GGML_FP32_TO_FP16(value);
            } break;
        case GGML_TYPE_BF16:
            {
                ((ggml_bf16_t *)(tensor->data))[i] = GGML_FP32_TO_BF16(value);
            } break;
        case GGML_TYPE_F32:
            {
                ((float *)(tensor->data))[i] = value;
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}